

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::WBClearObject
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,char *addr)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  BVIndex i;
  undefined8 *in_FS_OFFSET;
  
  uVar5 = (int)addr - *(int *)&(this->super_HeapBlock).address;
  uVar4 = this->objectSize;
  if (uVar5 % (uint)uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.h"
                       ,0x275,"((uint)(addr - this->address) % this->objectSize == 0)",
                       "(uint)(addr - this->address) % this->objectSize == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    uVar4 = this->objectSize;
    uVar5 = (int)addr - *(int *)&(this->super_HeapBlock).address;
  }
  i = uVar5 >> 3;
  uVar5 = (uint)(uVar4 >> 3);
  while (bVar3 = uVar5 != 0, uVar5 = uVar5 - 1, bVar3) {
    BVStatic<512UL>::TestAndClearInterlocked(&this->wbVerifyBits,i);
    i = i + 1;
  }
  return;
}

Assistant:

virtual void WBClearObject(char* addr) override
    {
        Assert((uint)(addr - this->address) % this->objectSize == 0);
        uint index = (uint)(addr - this->address) / sizeof(void*);
        uint count = (uint)(this->objectSize / sizeof(void*));
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.TestAndClearInterlocked(index + i);
        }
    }